

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O3

bool __thiscall
node::BlockManager::WriteBlockToDisk(BlockManager *this,CBlock *block,FlatFilePos *pos)

{
  SizeComputer SVar1;
  SizeComputer __stream;
  long lVar2;
  size_t in_RCX;
  bool bVar3;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  TransactionSerParams *fmt;
  SizeComputer *args;
  vector<std::byte,_std::allocator<std::byte>_> local_58;
  SizeComputer local_40;
  VectorFormatter<DefaultFormatter> local_31;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  __stream.nSize = (size_t)FlatFileSeq::Open(&this->m_block_file_seq,pos,false);
  std::vector<std::byte,_std::allocator<std::byte>_>::vector(&local_58,&this->m_xor_key);
  fmt = (TransactionSerParams *)
        local_58.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_start;
  if ((FILE *)__stream.nSize == (FILE *)0x0) {
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
    ;
    source_file._M_len = 0x5e;
    logging_function._M_str = "WriteBlockToDisk";
    logging_function._M_len = 0x10;
    LogPrintf_<char[17]>
              (logging_function,source_file,0x3cf,
               IPC|I2P|VALIDATION|LEVELDB|QT|MEMPOOLREJ|PROXY|CMPCTBLOCK|REINDEX|ESTIMATEFEE|BENCH|
               HTTP|TOR|NET,Trace,
               (char *)local_58.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_start,
               (char (*) [17])
               local_58.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_finish);
  }
  else {
    local_58.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = &::TX_WITH_WITNESS.allow_witness;
    local_40.nSize = 0x50;
    args = (SizeComputer *)
           local_58.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
           super__Vector_impl_data._M_finish;
    local_58.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)&local_40;
    VectorFormatter<DefaultFormatter>::
    Ser<ParamsStream<SizeComputer&,TransactionSerParams>,std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>>
              (&local_31,(ParamsStream<SizeComputer_&,_TransactionSerParams> *)&local_58,&block->vtx
              );
    SVar1.nSize = local_40.nSize;
    AutoFile::write((AutoFile *)&stack0xffffffffffffff88,(int)(this->m_opts).chainparams + 0x170,
                    (void *)0x4,in_RCX);
    local_58.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_58.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,(int)SVar1.nSize);
    AutoFile::write((AutoFile *)&stack0xffffffffffffff88,(int)&local_58,(void *)0x4,in_RCX);
    lVar2 = ftell((FILE *)__stream.nSize);
    if (-1 < lVar2) {
      pos->nPos = (uint)lVar2;
      local_58.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start = &::TX_WITH_WITNESS.allow_witness;
      local_58.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)&stack0xffffffffffffff88;
      CBlock::
      SerializationOps<ParamsStream<AutoFile&,TransactionSerParams>,CBlock_const,ActionSerialize>
                (block);
      bVar3 = true;
      goto LAB_0091f8c4;
    }
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
    ;
    source_file_00._M_len = 0x5e;
    logging_function_00._M_str = "WriteBlockToDisk";
    logging_function_00._M_len = 0x10;
    LogPrintf_<char[17]>
              (logging_function_00,source_file_00,0x3da,
               IPC|I2P|VALIDATION|LEVELDB|QT|LIBEVENT|PRUNE|RAND|REINDEX|ADDRMAN|ESTIMATEFEE|RPC|
               WALLETDB|HTTP|TOR|NET,(Level)__stream.nSize,&fmt->allow_witness,(char (*) [17])args);
  }
  bVar3 = false;
LAB_0091f8c4:
  AutoFile::~AutoFile((AutoFile *)&stack0xffffffffffffff88);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool BlockManager::WriteBlockToDisk(const CBlock& block, FlatFilePos& pos) const
{
    // Open history file to append
    AutoFile fileout{OpenBlockFile(pos)};
    if (fileout.IsNull()) {
        LogError("%s: OpenBlockFile failed\n", __func__);
        return false;
    }

    // Write index header
    unsigned int nSize = GetSerializeSize(TX_WITH_WITNESS(block));
    fileout << GetParams().MessageStart() << nSize;

    // Write block
    long fileOutPos = ftell(fileout.Get());
    if (fileOutPos < 0) {
        LogError("%s: ftell failed\n", __func__);
        return false;
    }
    pos.nPos = (unsigned int)fileOutPos;
    fileout << TX_WITH_WITNESS(block);

    return true;
}